

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kp_space_time_stack.cpp
# Opt level: O3

void __thiscall
KokkosTools::SpaceTimeStack::State::begin_deep_copy
          (State *this,Space dst_space,char *dst_name,void *param_3,Space src_space,char *src_name,
          void *param_6,uint64_t param_7)

{
  char *local_50;
  undefined8 local_48;
  char local_40;
  undefined7 uStack_3f;
  
  local_48 = 0;
  local_40 = '\0';
  local_50 = &local_40;
  std::__cxx11::string::append((char *)&local_50);
  std::__cxx11::string::append((char *)&local_50);
  std::__cxx11::string::append((char *)&local_50);
  std::__cxx11::string::append((char *)&local_50);
  std::__cxx11::string::append((char *)&local_50);
  if (dst_space < (SPACE_OMPT|SPACE_CUDA)) {
    std::__cxx11::string::append((char *)&local_50);
    std::__cxx11::string::append((char *)&local_50);
    if (src_space < (SPACE_OMPT|SPACE_CUDA)) {
      std::__cxx11::string::append((char *)&local_50);
      std::__cxx11::string::append((char *)&local_50);
      begin_frame(this,local_50,STACK_COPY);
      if (local_50 != &local_40) {
        operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
      }
      return;
    }
  }
  abort();
}

Assistant:

void begin_deep_copy(Space dst_space, const char* dst_name, const void*,
                       Space src_space, const char* src_name, const void*,
                       std::uint64_t) {
    std::string frame_name;
    frame_name += "\"";
    frame_name += dst_name;
    frame_name += "\"=\"";
    frame_name += src_name;
    frame_name += "\" (";
    frame_name += get_space_name(dst_space);
    frame_name += "->";
    frame_name += get_space_name(src_space);
    frame_name += ")";
    begin_frame(frame_name.c_str(), STACK_COPY);
  }